

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData_Soviet.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData_Soviet::operator==
          (FundamentalOperationalData_Soviet *this,FundamentalOperationalData_Soviet *Value)

{
  FundamentalOperationalData_Soviet *Value_local;
  FundamentalOperationalData_Soviet *this_local;
  
  if ((this->field_0).m_ui8SystemStatus == (Value->field_0).m_ui8SystemStatus) {
    if (this->m_ui8AltParam4 == Value->m_ui8AltParam4) {
      if ((this->field_2).m_ui8InfoLayers == (Value->field_2).m_ui8InfoLayers) {
        if (this->m_ui8Modifier == Value->m_ui8Modifier) {
          if ((this->field_4).m_ui16Param1 == (Value->field_4).m_ui16Param1) {
            if ((this->field_5).m_ui16Param2 == (Value->field_5).m_ui16Param2) {
              if ((this->field_6).m_ui16Param3 == (Value->field_6).m_ui16Param3) {
                if ((this->field_7).m_ui16Param4 == (Value->field_7).m_ui16Param4) {
                  if ((this->field_8).m_ui16Param5 == (Value->field_8).m_ui16Param5) {
                    if ((this->field_9).m_ui16Param6 == (Value->field_9).m_ui16Param6) {
                      this_local._7_1_ = true;
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL FundamentalOperationalData_Soviet::operator == ( const FundamentalOperationalData_Soviet & Value ) const
{
    if( m_ui8SystemStatus   != Value.m_ui8SystemStatus )    return false;
    if( m_ui8AltParam4      != Value.m_ui8AltParam4 )       return false;
    if( m_ui8InfoLayers     != Value.m_ui8InfoLayers )      return false;
    if( m_ui8Modifier       != Value.m_ui8Modifier )        return false;
    if( m_ui16Param1        != Value.m_ui16Param1 )         return false;
    if( m_ui16Param2        != Value.m_ui16Param2 )         return false;
    if( m_ui16Param3        != Value.m_ui16Param3 )         return false;
    if( m_ui16Param4        != Value.m_ui16Param4 )         return false;
    if( m_ui16Param5        != Value.m_ui16Param5 )         return false;
    if( m_ui16Param6        != Value.m_ui16Param6 )         return false;
    return true;
}